

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandScope::compileDeclExpression
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandScope *this,
          Reader source,Resolver *resolver,ImplicitParams implicitMethodParams)

{
  Reader *__return_storage_ptr___00;
  int *piVar1;
  ErrorReporter *pEVar2;
  Reader source_00;
  Reader source_01;
  Reader RVar3;
  Reader name_00;
  undefined2 uVar4;
  Resolver *pRVar5;
  bool bVar6;
  bool bVar7;
  Which WVar8;
  uint uVar9;
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  *pNVar10;
  OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
  *pOVar11;
  BrandedDecl *pBVar12;
  NullableValue<capnp::compiler::Resolver::ResolvedDecl> *other;
  ResolvedDecl *pRVar13;
  BrandedDecl *pBVar14;
  NullableValue<capnp::compiler::BrandedDecl> *pNVar15;
  NullableValue<unsigned_long> *other_00;
  unsigned_long *puVar16;
  Reader *params_1;
  Reader RVar17;
  Iterator IVar18;
  StringPtr memberName;
  ResolvedParameter variable;
  uint64_t uVar19;
  ArrayPtr<const_char> local_15f0;
  Reader local_15e0;
  String local_15b0;
  String local_1598;
  ArrayPtr<const_char> local_1580;
  Type local_1570;
  undefined1 local_1568 [32];
  unsigned_long *local_1548;
  unsigned_long *id;
  undefined1 local_1530 [8];
  NullableValue<unsigned_long> _id659;
  BrandedDecl *memberDecl;
  Maybe<capnp::compiler::BrandedDecl> local_14c0;
  undefined1 local_1410 [8];
  NullableValue<capnp::compiler::BrandedDecl> _memberDecl658;
  Reader name_2;
  BrandedDecl *decl_2;
  Reader local_12e8;
  Maybe<capnp::compiler::BrandedDecl> local_12b8;
  undefined1 local_1208 [8];
  NullableValue<capnp::compiler::BrandedDecl> _decl656;
  Reader member;
  BrandedDecl *applied;
  Array<capnp::compiler::BrandedDecl> local_10e8;
  Maybe<capnp::compiler::BrandedDecl> local_10d0;
  undefined1 local_1020 [8];
  NullableValue<capnp::compiler::BrandedDecl> _applied642;
  BrandedDecl *d;
  Reader local_f30;
  Maybe<capnp::compiler::BrandedDecl> local_f00;
  undefined1 local_e50 [8];
  NullableValue<capnp::compiler::BrandedDecl> _d629;
  Reader local_d90;
  undefined1 local_d60 [8];
  Reader param;
  undefined1 local_d20 [8];
  Iterator __end5;
  undefined1 local_d00 [8];
  Iterator __begin5;
  Reader *__range5;
  undefined1 local_ce0 [7];
  bool paramFailed;
  ArrayBuilder<capnp::compiler::BrandedDecl> compiledParams;
  Reader params;
  BrandedDecl *decl_1;
  Reader local_c48;
  Maybe<capnp::compiler::BrandedDecl> local_c18;
  undefined1 local_b68 [8];
  NullableValue<capnp::compiler::BrandedDecl> _decl619;
  Reader app;
  ArrayPtr<const_char> local_a80;
  String local_a70;
  ArrayPtr<const_char> local_a58;
  SegmentReader *local_a48;
  CapTableReader *pCStack_a40;
  void *local_a38;
  WirePointer *pWStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> local_a10;
  ResolvedDecl local_a00;
  BrandedDecl local_9a0;
  Type local_8f8;
  undefined1 local_8f0 [32];
  ResolvedDecl *local_8d0;
  ResolvedDecl *decl;
  undefined4 uStack_8c0;
  undefined4 uStack_8bc;
  undefined4 local_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  Maybe<capnp::compiler::Resolver::ResolvedDecl> local_8a0;
  undefined1 local_838 [8];
  NullableValue<capnp::compiler::Resolver::ResolvedDecl> _decl602;
  Reader filename;
  ArrayPtr<const_char> local_798;
  String local_788;
  ArrayPtr<const_char> local_770;
  Type local_760;
  undefined1 local_758 [32];
  SegmentReader *local_738;
  CapTableReader *pCStack_730;
  void *local_728;
  WirePointer *pWStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined1 local_708 [8];
  BrandedDecl result_1;
  OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter> *r_1;
  ResolvedDecl local_638;
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_5d8;
  undefined1 local_568 [8];
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  _r584;
  Reader name_1;
  String local_4c0;
  ArrayPtr<const_char> local_4a8;
  undefined4 local_494;
  Type local_490;
  undefined1 local_488 [32];
  SegmentReader *local_468;
  CapTableReader *pCStack_460;
  void *local_458;
  WirePointer *pWStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined1 local_438 [8];
  BrandedDecl result;
  OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter> *r;
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_378;
  undefined1 local_308 [8];
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  _r566;
  BrandedDecl local_250;
  BrandedDecl local_198;
  Reader local_f0;
  ArrayPtr<const_char> local_c0;
  unsigned_long local_b0;
  unsigned_long i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_long> *__range3;
  Reader nameValue;
  Reader name;
  ArrayPtr<const_char> local_38;
  Resolver *local_20;
  Resolver *resolver_local;
  BrandScope *this_local;
  
  local_20 = resolver;
  resolver_local = (Resolver *)this;
  this_local = (BrandScope *)__return_storage_ptr__;
  WVar8 = Expression::Reader::which(&source);
  switch(WVar8) {
  case UNKNOWN:
    kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__);
    break;
  case POSITIVE_INT:
  case NEGATIVE_INT:
  case FLOAT:
  case STRING:
  case LIST:
  case TUPLE:
  case BINARY:
  case EMBED:
    pEVar2 = this->errorReporter;
    kj::StringPtr::StringPtr((StringPtr *)&local_38,"Expected name.");
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
              (pEVar2,&source,(StringPtr)local_38);
    kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__);
    break;
  case RELATIVE_NAME:
    Expression::Reader::getRelativeName((Reader *)&nameValue.super_StringPtr.content.size_,&source);
    ___range3 = (ArrayPtr<const_char>)
                LocatedText::Reader::getValue((Reader *)&nameValue.super_StringPtr.content.size_);
    ___begin3 = kj::
                indices<capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                          (&implicitMethodParams.params);
    __end3 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3);
    i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3);
    while (bVar6 = kj::Range<unsigned_long>::Iterator::operator==(&__end3,(Iterator *)&i),
          ((bVar6 ^ 0xffU) & 1) != 0) {
      puVar16 = kj::Range<unsigned_long>::Iterator::operator*(&__end3);
      local_b0 = *puVar16;
      List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::operator[]
                (&local_f0,&implicitMethodParams.params,(uint)local_b0);
      local_c0 = (ArrayPtr<const_char>)Declaration::BrandParameter::Reader::getName(&local_f0);
      bVar6 = kj::StringPtr::operator==((StringPtr *)&local_c0,(StringPtr *)&__range3);
      if (bVar6) {
        uVar19 = implicitMethodParams.scopeId;
        if (implicitMethodParams.scopeId == 0) {
          BrandedDecl::implicitMethodParam(&local_198,(uint)local_b0);
          kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__,&local_198);
          BrandedDecl::~BrandedDecl(&local_198);
          return __return_storage_ptr__;
        }
        uVar4 = (undefined2)local_b0;
        _r566.field_1._96_8_ = 0;
        Expression::Reader::Reader((Reader *)((long)&_r566.field_1 + 0x60));
        variable.index._0_2_ = uVar4;
        variable.id = uVar19;
        variable._10_6_ = 0;
        BrandedDecl::BrandedDecl(&local_250,variable,(Reader)ZEXT848((ulong)_r566.field_1._96_8_));
        kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__,&local_250);
        BrandedDecl::~BrandedDecl(&local_250);
        return __return_storage_ptr__;
      }
      kj::Range<unsigned_long>::Iterator::operator++(&__end3);
    }
    params_1 = (Reader *)__range3._8_8_;
    (**local_20->_vptr_Resolver)(&local_378,local_20,__range3);
    pNVar10 = kj::_::
              readMaybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,capnp::compiler::Resolver::ResolvedParameter>>
                        (&local_378);
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                     *)local_308,pNVar10);
    kj::
    Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::~Maybe(&local_378);
    pOVar11 = kj::_::NullableValue::operator_cast_to_OneOf_((NullableValue *)local_308);
    if (pOVar11 ==
        (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
         *)0x0) {
      pEVar2 = this->errorReporter;
      kj::str<char_const(&)[14],capnp::Text::Reader&>
                (&local_4c0,(kj *)"Not defined: ",(char (*) [14])&__range3,params_1);
      kj::StringPtr::StringPtr((StringPtr *)&local_4a8,&local_4c0);
      ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                (pEVar2,(Reader *)&nameValue.super_StringPtr.content.size_,(StringPtr)local_4a8);
      kj::String::~String(&local_4c0);
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__);
      local_494 = 1;
    }
    else {
      result.source._reader._40_8_ =
           kj::_::
           NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
           ::operator*((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                        *)local_308);
      RVar3 = source;
      local_468 = source._reader.segment;
      pCStack_460 = source._reader.capTable;
      local_458 = source._reader.data;
      pWStack_450 = source._reader.pointers;
      local_448._0_4_ = source._reader.dataSize;
      local_448._4_2_ = source._reader.pointerCount;
      local_448._6_2_ = source._reader._38_2_;
      source._reader._40_8_ = RVar3._reader._40_8_;
      uStack_440._0_4_ = source._reader.nestingLimit;
      uStack_440._4_4_ = source._reader._44_4_;
      source = RVar3;
      interpretResolve((BrandedDecl *)local_438,this,local_20,
                       (ResolveResult *)result.source._reader._40_8_,RVar3);
      bVar6 = kj::
              OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
              ::is<capnp::compiler::Resolver::ResolvedDecl>
                        ((OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                          *)result.source._reader._40_8_);
      if (bVar6) {
        pEVar2 = this->errorReporter;
        local_488._0_4_ = Expression::Reader::getStartByte(&source);
        local_488._4_4_ = Expression::Reader::getEndByte(&source);
        pRVar13 = kj::
                  OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                  ::get<capnp::compiler::Resolver::ResolvedDecl>
                            ((OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                              *)result.source._reader._40_8_);
        local_490.typeId = pRVar13->id;
        kj::OneOf<capnp::compiler::Resolution::Type,capnp::compiler::Resolution::Member>::
        OneOf<capnp::compiler::Resolution::Type,int>
                  ((OneOf<capnp::compiler::Resolution::Type,capnp::compiler::Resolution::Member> *)
                   (local_488 + 8),&local_490);
        (*pEVar2->_vptr_ErrorReporter[2])(pEVar2,local_488);
        Resolution::~Resolution((Resolution *)local_488);
      }
      pBVar12 = kj::mv<capnp::compiler::BrandedDecl>((BrandedDecl *)local_438);
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__,pBVar12);
      local_494 = 1;
      BrandedDecl::~BrandedDecl((BrandedDecl *)local_438);
    }
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::~NullableValue((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                      *)local_308);
    break;
  case APPLICATION:
    piVar1 = &_decl619.field_1.value.source._reader.nestingLimit;
    Expression::Reader::getApplication((Reader *)piVar1,&source);
    Expression::Application::Reader::getFunction(&local_c48,(Reader *)piVar1);
    source_00._reader.capTable = local_c48._reader.capTable;
    source_00._reader.segment = local_c48._reader.segment;
    source_00._reader.data = local_c48._reader.data;
    source_00._reader.pointers = local_c48._reader.pointers;
    source_00._reader.dataSize = local_c48._reader.dataSize;
    source_00._reader.pointerCount = local_c48._reader.pointerCount;
    source_00._reader._38_2_ = local_c48._reader._38_2_;
    source_00._reader.nestingLimit = local_c48._reader.nestingLimit;
    source_00._reader._44_4_ = local_c48._reader._44_4_;
    compileDeclExpression(&local_c18,this,source_00,local_20,implicitMethodParams);
    pNVar15 = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_c18);
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
              ((NullableValue<capnp::compiler::BrandedDecl> *)local_b68,pNVar15);
    kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_c18);
    pBVar12 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_b68);
    if (pBVar12 == (BrandedDecl *)0x0) {
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__);
      local_494 = 1;
    }
    else {
      pBVar12 = kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                          ((NullableValue<capnp::compiler::BrandedDecl> *)local_b68);
      Expression::Application::Reader::getParams
                ((Reader *)&compiledParams.disposer,
                 (Reader *)&_decl619.field_1.value.source._reader.nestingLimit);
      uVar9 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::size
                        ((Reader *)&compiledParams.disposer);
      kj::heapArrayBuilder<capnp::compiler::BrandedDecl>
                ((ArrayBuilder<capnp::compiler::BrandedDecl> *)local_ce0,(ulong)uVar9);
      bVar6 = false;
      __begin5._8_8_ = &compiledParams.disposer;
      IVar18 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::begin
                         ((Reader *)__begin5._8_8_);
      __end5._8_8_ = IVar18.container;
      __begin5.container._0_4_ = IVar18.index;
      local_d00 = (undefined1  [8])__end5._8_8_;
      IVar18 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::end
                         ((Reader *)__begin5._8_8_);
      param._reader._40_8_ = IVar18.container;
      __end5.container._0_4_ = IVar18.index;
      local_d20 = (undefined1  [8])param._reader._40_8_;
      while (bVar7 = capnp::_::
                     IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                     ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                                   *)local_d00,
                                  (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                                   *)local_d20), ((bVar7 ^ 0xffU) & 1) != 0) {
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
        ::operator*((Reader *)local_d60,
                    (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                     *)local_d00);
        bVar7 = Expression::Param::Reader::isNamed((Reader *)local_d60);
        if (bVar7) {
          pEVar2 = this->errorReporter;
          Expression::Param::Reader::getNamed(&local_d90,(Reader *)local_d60);
          kj::StringPtr::StringPtr
                    ((StringPtr *)&_d629.field_1.value.source._reader.nestingLimit,
                     "Named parameter not allowed here.");
          ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader>
                    (pEVar2,&local_d90,(StringPtr)stack0xfffffffffffff260);
        }
        Expression::Param::Reader::getValue(&local_f30,(Reader *)local_d60);
        source_01._reader.capTable = local_f30._reader.capTable;
        source_01._reader.segment = local_f30._reader.segment;
        source_01._reader.data = local_f30._reader.data;
        source_01._reader.pointers = local_f30._reader.pointers;
        source_01._reader.dataSize = local_f30._reader.dataSize;
        source_01._reader.pointerCount = local_f30._reader.pointerCount;
        source_01._reader._38_2_ = local_f30._reader._38_2_;
        source_01._reader.nestingLimit = local_f30._reader.nestingLimit;
        source_01._reader._44_4_ = local_f30._reader._44_4_;
        compileDeclExpression(&local_f00,this,source_01,local_20,implicitMethodParams);
        pNVar15 = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_f00);
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                  ((NullableValue<capnp::compiler::BrandedDecl> *)local_e50,pNVar15);
        kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_f00);
        pBVar14 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_e50);
        if (pBVar14 == (BrandedDecl *)0x0) {
          bVar6 = true;
        }
        else {
          _applied642.field_1._160_8_ =
               kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                         ((NullableValue<capnp::compiler::BrandedDecl> *)local_e50);
          pBVar14 = kj::mv<capnp::compiler::BrandedDecl>((BrandedDecl *)_applied642.field_1._160_8_)
          ;
          kj::ArrayBuilder<capnp::compiler::BrandedDecl>::add<capnp::compiler::BrandedDecl>
                    ((ArrayBuilder<capnp::compiler::BrandedDecl> *)local_ce0,pBVar14);
        }
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                  ((NullableValue<capnp::compiler::BrandedDecl> *)local_e50);
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
        ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                      *)local_d00);
      }
      if (bVar6) {
        pBVar12 = kj::mv<capnp::compiler::BrandedDecl>(pBVar12);
        kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__,pBVar12);
        local_494 = 1;
      }
      else {
        kj::ArrayBuilder<capnp::compiler::BrandedDecl>::finish
                  (&local_10e8,(ArrayBuilder<capnp::compiler::BrandedDecl> *)local_ce0);
        BrandedDecl::applyParams(&local_10d0,pBVar12,&local_10e8,source);
        pNVar15 = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_10d0);
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                  ((NullableValue<capnp::compiler::BrandedDecl> *)local_1020,pNVar15);
        kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_10d0);
        kj::Array<capnp::compiler::BrandedDecl>::~Array(&local_10e8);
        pBVar14 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_1020);
        if (pBVar14 == (BrandedDecl *)0x0) {
          pBVar12 = kj::mv<capnp::compiler::BrandedDecl>(pBVar12);
          kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__,pBVar12);
        }
        else {
          pBVar12 = kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                              ((NullableValue<capnp::compiler::BrandedDecl> *)local_1020);
          pBVar12 = kj::mv<capnp::compiler::BrandedDecl>(pBVar12);
          kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__,pBVar12);
        }
        local_494 = 1;
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                  ((NullableValue<capnp::compiler::BrandedDecl> *)local_1020);
      }
      kj::ArrayBuilder<capnp::compiler::BrandedDecl>::~ArrayBuilder
                ((ArrayBuilder<capnp::compiler::BrandedDecl> *)local_ce0);
    }
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::BrandedDecl> *)local_b68);
    break;
  case MEMBER:
    piVar1 = &_decl656.field_1.value.source._reader.nestingLimit;
    Expression::Reader::getMember((Reader *)piVar1,&source);
    Expression::Member::Reader::getParent(&local_12e8,(Reader *)piVar1);
    RVar3._reader.capTable = local_12e8._reader.capTable;
    RVar3._reader.segment = local_12e8._reader.segment;
    RVar3._reader.data = local_12e8._reader.data;
    RVar3._reader.pointers = local_12e8._reader.pointers;
    RVar3._reader.dataSize = local_12e8._reader.dataSize;
    RVar3._reader.pointerCount = local_12e8._reader.pointerCount;
    RVar3._reader._38_2_ = local_12e8._reader._38_2_;
    RVar3._reader.nestingLimit = local_12e8._reader.nestingLimit;
    RVar3._reader._44_4_ = local_12e8._reader._44_4_;
    uVar19 = implicitMethodParams.scopeId;
    compileDeclExpression(&local_12b8,this,RVar3,local_20,implicitMethodParams);
    pNVar15 = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_12b8);
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
              ((NullableValue<capnp::compiler::BrandedDecl> *)local_1208,pNVar15);
    kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_12b8);
    pBVar12 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_1208);
    if (pBVar12 == (BrandedDecl *)0x0) {
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__);
      local_494 = 1;
    }
    else {
      pBVar12 = kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                          ((NullableValue<capnp::compiler::BrandedDecl> *)local_1208);
      Expression::Member::Reader::getName
                ((Reader *)&_memberDecl658.field_1.value.source._reader.nestingLimit,
                 (Reader *)&_decl656.field_1.value.source._reader.nestingLimit);
      memberName.content =
           (ArrayPtr<const_char>)
           LocatedText::Reader::getValue
                     ((Reader *)&_memberDecl658.field_1.value.source._reader.nestingLimit);
      BrandedDecl::getMember(&local_14c0,pBVar12,memberName,source);
      pNVar15 = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_14c0);
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                ((NullableValue<capnp::compiler::BrandedDecl> *)local_1410,pNVar15);
      kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_14c0);
      pBVar12 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_1410);
      if (pBVar12 == (BrandedDecl *)0x0) {
        pEVar2 = this->errorReporter;
        Expression::Member::Reader::getParent
                  (&local_15e0,(Reader *)&_decl656.field_1.value.source._reader.nestingLimit);
        name_00._reader.capTable = (CapTableReader *)local_15e0._reader.data;
        name_00._reader.segment = (SegmentReader *)local_15e0._reader.capTable;
        name_00._reader.data = local_15e0._reader.pointers;
        name_00._reader.pointers = (WirePointer *)local_15e0._reader._32_8_;
        name_00._reader.dataSize = local_15e0._reader.nestingLimit;
        name_00._reader.pointerCount = local_15e0._reader._44_2_;
        name_00._reader._38_2_ = local_15e0._reader._46_2_;
        name_00._reader._40_8_ = uVar19;
        expressionString(name_00);
        local_15f0 = (ArrayPtr<const_char>)
                     LocatedText::Reader::getValue
                               ((Reader *)&_memberDecl658.field_1.value.source._reader.nestingLimit)
        ;
        kj::str<char_const(&)[2],kj::String,char_const(&)[24],capnp::Text::Reader,char_const(&)[2]>
                  (&local_1598,(kj *)0x3ac820,(char (*) [2])&local_15b0,
                   (String *)"\' has no member named \'",(char (*) [24])&local_15f0,
                   (Reader *)0x3ac820,(char (*) [2])local_15e0._reader.segment);
        kj::StringPtr::StringPtr((StringPtr *)&local_1580,&local_1598);
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                  (pEVar2,(Reader *)&_memberDecl658.field_1.value.source._reader.nestingLimit,
                   (StringPtr)local_1580);
        kj::String::~String(&local_1598);
        kj::String::~String(&local_15b0);
        kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__);
      }
      else {
        _id659.field_1 =
             (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
             kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                       ((NullableValue<capnp::compiler::BrandedDecl> *)local_1410);
        BrandedDecl::getGenericTypeId((BrandedDecl *)&id);
        other_00 = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&id);
        kj::_::NullableValue<unsigned_long>::NullableValue
                  ((NullableValue<unsigned_long> *)local_1530,other_00);
        kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&id);
        puVar16 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_1530)
        ;
        if (puVar16 != (unsigned_long *)0x0) {
          local_1548 = kj::_::NullableValue<unsigned_long>::operator*
                                 ((NullableValue<unsigned_long> *)local_1530);
          pEVar2 = this->errorReporter;
          local_1568._0_4_ = Expression::Reader::getStartByte(&source);
          local_1568._4_4_ = Expression::Reader::getEndByte(&source);
          local_1570.typeId = *local_1548;
          kj::OneOf<capnp::compiler::Resolution::Type,capnp::compiler::Resolution::Member>::
          OneOf<capnp::compiler::Resolution::Type,int>
                    ((OneOf<capnp::compiler::Resolution::Type,capnp::compiler::Resolution::Member> *
                     )(local_1568 + 8),&local_1570);
          (*pEVar2->_vptr_ErrorReporter[2])(pEVar2,local_1568);
          Resolution::~Resolution((Resolution *)local_1568);
        }
        kj::_::NullableValue<unsigned_long>::~NullableValue
                  ((NullableValue<unsigned_long> *)local_1530);
        pBVar12 = kj::mv<capnp::compiler::BrandedDecl>((BrandedDecl *)_id659.field_1);
        kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__,pBVar12);
      }
      local_494 = 1;
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                ((NullableValue<capnp::compiler::BrandedDecl> *)local_1410);
    }
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::BrandedDecl> *)local_1208);
    break;
  case ABSOLUTE_NAME:
    __return_storage_ptr___00 = (Reader *)((long)&_r584.field_1 + 0x60);
    Expression::Reader::getAbsoluteName(__return_storage_ptr___00,&source);
    (*local_20->_vptr_Resolver[5])(&local_638);
    RVar17 = LocatedText::Reader::getValue(__return_storage_ptr___00);
    (*(local_638.resolver)->_vptr_Resolver[1])
              (&local_5d8,local_638.resolver,RVar17.super_StringPtr.content.ptr,
               RVar17.super_StringPtr.content.size_);
    pNVar10 = kj::_::
              readMaybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,capnp::compiler::Resolver::ResolvedParameter>>
                        (&local_5d8);
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                     *)local_568,pNVar10);
    kj::
    Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::~Maybe(&local_5d8);
    Resolver::ResolvedDecl::~ResolvedDecl(&local_638);
    pOVar11 = kj::_::NullableValue::operator_cast_to_OneOf_((NullableValue *)local_568);
    if (pOVar11 ==
        (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
         *)0x0) {
      pEVar2 = this->errorReporter;
      local_798 = (ArrayPtr<const_char>)
                  LocatedText::Reader::getValue((Reader *)((long)&_r584.field_1 + 0x60));
      kj::str<char_const(&)[14],capnp::Text::Reader>
                (&local_788,(kj *)"Not defined: ",(char (*) [14])&local_798,(Reader *)local_798.ptr)
      ;
      kj::StringPtr::StringPtr((StringPtr *)&local_770,&local_788);
      ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                (pEVar2,(Reader *)((long)&_r584.field_1 + 0x60),(StringPtr)local_770);
      kj::String::~String(&local_788);
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__);
      local_494 = 1;
    }
    else {
      result_1.source._reader._40_8_ =
           kj::_::
           NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
           ::operator*((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                        *)local_568);
      RVar3 = source;
      local_738 = source._reader.segment;
      pCStack_730 = source._reader.capTable;
      local_728 = source._reader.data;
      pWStack_720 = source._reader.pointers;
      local_718._0_4_ = source._reader.dataSize;
      local_718._4_2_ = source._reader.pointerCount;
      local_718._6_2_ = source._reader._38_2_;
      source._reader._40_8_ = RVar3._reader._40_8_;
      uStack_710._0_4_ = source._reader.nestingLimit;
      uStack_710._4_4_ = source._reader._44_4_;
      source = RVar3;
      interpretResolve((BrandedDecl *)local_708,this,local_20,
                       (ResolveResult *)result_1.source._reader._40_8_,RVar3);
      bVar6 = kj::
              OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
              ::is<capnp::compiler::Resolver::ResolvedDecl>
                        ((OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                          *)result_1.source._reader._40_8_);
      if (bVar6) {
        pEVar2 = this->errorReporter;
        local_758._0_4_ = Expression::Reader::getStartByte(&source);
        local_758._4_4_ = Expression::Reader::getEndByte(&source);
        pRVar13 = kj::
                  OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                  ::get<capnp::compiler::Resolver::ResolvedDecl>
                            ((OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                              *)result_1.source._reader._40_8_);
        local_760.typeId = pRVar13->id;
        kj::OneOf<capnp::compiler::Resolution::Type,capnp::compiler::Resolution::Member>::
        OneOf<capnp::compiler::Resolution::Type,int>
                  ((OneOf<capnp::compiler::Resolution::Type,capnp::compiler::Resolution::Member> *)
                   (local_758 + 8),&local_760);
        (*pEVar2->_vptr_ErrorReporter[2])(pEVar2,local_758);
        Resolution::~Resolution((Resolution *)local_758);
      }
      pBVar12 = kj::mv<capnp::compiler::BrandedDecl>((BrandedDecl *)local_708);
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__,pBVar12);
      local_494 = 1;
      BrandedDecl::~BrandedDecl((BrandedDecl *)local_708);
    }
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::~NullableValue((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                      *)local_568);
    break;
  case IMPORT:
    piVar1 = &_decl602.field_1.value.brand.ptr.field_1.value._reader.nestingLimit;
    Expression::Reader::getImport((Reader *)piVar1,&source);
    pRVar5 = local_20;
    _decl = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)piVar1);
    local_8b8 = decl._0_4_;
    uStack_8b4 = decl._4_4_;
    uStack_8b0 = uStack_8c0;
    uStack_8ac = uStack_8bc;
    (*pRVar5->_vptr_Resolver[8])(&local_8a0,pRVar5,decl,decl._8_8_);
    other = kj::_::readMaybe<capnp::compiler::Resolver::ResolvedDecl>(&local_8a0);
    kj::_::NullableValue<capnp::compiler::Resolver::ResolvedDecl>::NullableValue
              ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)local_838,other);
    kj::Maybe<capnp::compiler::Resolver::ResolvedDecl>::~Maybe(&local_8a0);
    pRVar13 = kj::_::NullableValue::operator_cast_to_ResolvedDecl_((NullableValue *)local_838);
    if (pRVar13 == (ResolvedDecl *)0x0) {
      pEVar2 = this->errorReporter;
      local_a80 = (ArrayPtr<const_char>)
                  LocatedText::Reader::getValue
                            ((Reader *)
                             &_decl602.field_1.value.brand.ptr.field_1.value._reader.nestingLimit);
      kj::str<char_const(&)[16],capnp::Text::Reader>
                (&local_a70,(kj *)"Import failed: ",(char (*) [16])&local_a80,
                 (Reader *)local_a80.ptr);
      kj::StringPtr::StringPtr((StringPtr *)&local_a58,&local_a70);
      ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                (pEVar2,(Reader *)
                        &_decl602.field_1.value.brand.ptr.field_1.value._reader.nestingLimit,
                 (StringPtr)local_a58);
      kj::String::~String(&local_a70);
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__);
    }
    else {
      local_8d0 = kj::_::NullableValue<capnp::compiler::Resolver::ResolvedDecl>::operator*
                            ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)local_838);
      pEVar2 = this->errorReporter;
      local_8f0._0_4_ = Expression::Reader::getStartByte(&source);
      local_8f0._4_4_ = Expression::Reader::getEndByte(&source);
      local_8f8.typeId = local_8d0->id;
      kj::OneOf<capnp::compiler::Resolution::Type,capnp::compiler::Resolution::Member>::
      OneOf<capnp::compiler::Resolution::Type,int>
                ((OneOf<capnp::compiler::Resolution::Type,capnp::compiler::Resolution::Member> *)
                 (local_8f0 + 8),&local_8f8);
      (*pEVar2->_vptr_ErrorReporter[2])(pEVar2,local_8f0);
      Resolution::~Resolution((Resolution *)local_8f0);
      Resolver::ResolvedDecl::ResolvedDecl(&local_a00,local_8d0);
      kj::
      refcounted<capnp::compiler::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&,unsigned_int&,capnp::compiler::Resolver&>
                ((kj *)&local_a10,this->errorReporter,&local_8d0->id,&local_8d0->genericParamCount,
                 local_8d0->resolver);
      RVar3 = source;
      local_a48 = source._reader.segment;
      pCStack_a40 = source._reader.capTable;
      local_a38 = source._reader.data;
      pWStack_a30 = source._reader.pointers;
      local_a28._0_4_ = source._reader.dataSize;
      local_a28._4_2_ = source._reader.pointerCount;
      local_a28._6_2_ = source._reader._38_2_;
      source._reader._40_8_ = RVar3._reader._40_8_;
      uStack_a20._0_4_ = source._reader.nestingLimit;
      uStack_a20._4_4_ = source._reader._44_4_;
      source = RVar3;
      BrandedDecl::BrandedDecl(&local_9a0,&local_a00,&local_a10,RVar3);
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__,&local_9a0);
      BrandedDecl::~BrandedDecl(&local_9a0);
      kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own(&local_a10);
      Resolver::ResolvedDecl::~ResolvedDecl(&local_a00);
    }
    local_494 = 1;
    kj::_::NullableValue<capnp::compiler::Resolver::ResolvedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)local_838);
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<BrandedDecl> BrandScope::compileDeclExpression(
    Expression::Reader source, Resolver& resolver,
    ImplicitParams implicitMethodParams) {
  switch (source.which()) {
    case Expression::UNKNOWN:
      // Error reported earlier.
      return kj::none;

    case Expression::POSITIVE_INT:
    case Expression::NEGATIVE_INT:
    case Expression::FLOAT:
    case Expression::STRING:
    case Expression::BINARY:
    case Expression::LIST:
    case Expression::TUPLE:
    case Expression::EMBED:
      errorReporter.addErrorOn(source, "Expected name.");
      return kj::none;

    case Expression::RELATIVE_NAME: {
      auto name = source.getRelativeName();
      auto nameValue = name.getValue();

      // Check implicit method params first.
      for (auto i: kj::indices(implicitMethodParams.params)) {
        if (implicitMethodParams.params[i].getName() == nameValue) {
          if (implicitMethodParams.scopeId == 0) {
            return BrandedDecl::implicitMethodParam(i);
          } else {
            return BrandedDecl(Resolver::ResolvedParameter {
                implicitMethodParams.scopeId, static_cast<uint16_t>(i) },
                Expression::Reader());
          }
        }
      }

      KJ_IF_SOME(r, resolver.resolve(nameValue)) {
        auto result = interpretResolve(resolver, r, source);
        if (r.is<Resolver::ResolvedDecl>()){
          errorReporter.reportResolution(Resolution {
            /* .startByte = */ source.getStartByte(),
            /* .endByte = */ source.getEndByte(),
            /* .target = */ Resolution::Type { r.get<Resolver::ResolvedDecl>().id },
          });
        }
        return kj::mv(result);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", nameValue));
        return kj::none;
      }
    }

    case Expression::ABSOLUTE_NAME: {
      auto name = source.getAbsoluteName();
      KJ_IF_SOME(r, resolver.getTopScope().resolver->resolveMember(name.getValue())) {
        auto result = interpretResolve(resolver, r, source);
        if (r.is<Resolver::ResolvedDecl>()){
          errorReporter.reportResolution(Resolution {
            /* .startByte = */ source.getStartByte(),
            /* .endByte = */ source.getEndByte(),
            /* .target = */ Resolution::Type { r.get<Resolver::ResolvedDecl>().id },
          });
        }
        return kj::mv(result);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", name.getValue()));
        return kj::none;
      }
    }